

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

Abc_Cex_t * Vga_ManDeriveCex(Vta_Man_t *p)

{
  Gia_Man_t *pGVar1;
  undefined8 uVar2;
  Abc_Cex_t *pAVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  
  iVar5 = p->pGia->nRegs;
  pAVar3 = Abc_CexAlloc(iVar5,p->pGia->vCis->nSize - iVar5,p->pPars->iFrame + 1);
  pAVar3->iPo = 0;
  pAVar3->iFrame = p->pPars->iFrame;
  uVar8 = (ulong)(uint)p->nObjs;
  if (1 < p->nObjs) {
    pGVar1 = p->pGia;
    piVar6 = &p->pObjs[1].iFrame;
    lVar7 = 1;
    do {
      iVar5 = ((Vta_Obj_t *)(piVar6 + -1))->iObj;
      if (((long)iVar5 < 0) || (pGVar1->nObjs <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar1->pObjs == (Gia_Obj_t *)0x0) {
        return pAVar3;
      }
      uVar2 = *(undefined8 *)(pGVar1->pObjs + iVar5);
      if (((~(uint)uVar2 & 0x9fffffff) == 0) &&
         (uVar4 = (uint)((ulong)uVar2 >> 0x20),
         (int)(uVar4 & 0x1fffffff) < pGVar1->vCis->nSize - pGVar1->nRegs)) {
        if ((int)uVar8 <= lVar7) {
          __assert_fail("pObj > p->pObjs && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                        ,0x69,"int Vta_ObjId(Vta_Man_t *, Vta_Obj_t *)");
        }
        if (p->pSat->size <= lVar7) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                        ,0xd4,"int sat_solver2_var_value(sat_solver2 *, int)");
        }
        if (p->pSat->model[lVar7] == 1) {
          iVar5 = (uVar4 & 0x1fffffff) + pAVar3->nRegs + pAVar3->nPis * *piVar6;
          (&pAVar3[1].iPo)[iVar5 >> 5] = (&pAVar3[1].iPo)[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
        }
      }
      lVar7 = lVar7 + 1;
      uVar8 = (ulong)p->nObjs;
      piVar6 = piVar6 + 4;
    } while (lVar7 < (long)uVar8);
  }
  return pAVar3;
}

Assistant:

Abc_Cex_t * Vga_ManDeriveCex( Vta_Man_t * p )
{
    Abc_Cex_t * pCex;
    Vta_Obj_t * pThis;
    Gia_Obj_t * pObj;
    int i;
    pCex = Abc_CexAlloc( Gia_ManRegNum(p->pGia), Gia_ManPiNum(p->pGia), p->pPars->iFrame+1 );
    pCex->iPo = 0;
    pCex->iFrame = p->pPars->iFrame;
    Vta_ManForEachObjObj( p, pThis, pObj, i )
        if ( Gia_ObjIsPi(p->pGia, pObj) && sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) )
            Abc_InfoSetBit( pCex->pData, pCex->nRegs + pThis->iFrame * pCex->nPis + Gia_ObjCioId(pObj) );
    return pCex;
}